

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::ConvertStringToDouble(string *input,double *output)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  double dVar4;
  char *end;
  char *local_20;
  
  bVar1 = false;
  if ((output != (double *)0x0) && (bVar1 = false, input->_M_string_length != 0)) {
    dVar4 = strtod((input->_M_dataplus)._M_p,&local_20);
    iVar2 = std::__cxx11::string::compare((char *)input);
    if ((iVar2 == 0) || ((*local_20 != '\0' || (piVar3 = __errno_location(), *piVar3 == 0x22)))) {
      bVar1 = false;
    }
    else {
      *output = dVar4;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool ConvertStringToDouble(const std::string& input, double* output) {
  if (input.empty() || NULL == output) {
    return false;
  }

  char* end;
  double converted_value(std::strtod(input.c_str(), &end));

  if (0 == input.compare(end) || '\0' != *end || ERANGE == errno) {
    return false;
  }

  *output = converted_value;
  return true;
}